

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpASIOServer.cpp
# Opt level: O0

void __thiscall mognetwork::TcpASIOServer::~TcpASIOServer(TcpASIOServer *this)

{
  undefined8 *in_RDI;
  Mutex *this_00;
  
  *in_RDI = &PTR__TcpASIOServer_00126a78;
  this_00 = (Mutex *)in_RDI[1];
  if (this_00 != (Mutex *)0x0) {
    (*this_00->_vptr_Mutex[1])();
  }
  if ((long *)in_RDI[0x17] != (long *)0x0) {
    (**(code **)(*(long *)in_RDI[0x17] + 8))();
  }
  if ((long *)in_RDI[0x22] != (long *)0x0) {
    (**(code **)(*(long *)in_RDI[0x22] + 8))();
  }
  std::__cxx11::list<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_>::~list
            ((list<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_> *)0x11a303);
  Mutex::~Mutex(this_00);
  TcpServerSocket::~TcpServerSocket((TcpServerSocket *)0x11a326);
  return;
}

Assistant:

TcpASIOServer::~TcpASIOServer()
  {
    delete m_serverListener;
    delete m_serverWriter;
    delete m_protocolFactory;
  }